

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void __thiscall
SSTableCache::SSTableCache
          (SSTableCache *this,SkipList *memTable,uint64_t timeStamp,string *_fileName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  unsigned_long uVar6;
  uint64_t uVar7;
  uint64_t *__args;
  string *psVar8;
  ConstIterator i;
  uint local_40 [2];
  ConstIterator local_38;
  
  (this->index).
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->index).
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->header).minKey = 0;
  (this->header).maxKey = 0;
  (this->header).timeStamp = 0;
  (this->header).length = 0;
  (this->index).
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BloomFilter::BloomFilter(&this->bloomFilter,memTable);
  paVar2 = &(this->fileName).field_2;
  (this->fileName)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (_fileName->_M_dataplus)._M_p;
  paVar1 = &_fileName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&_fileName->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->fileName).field_2 + 8) = uVar4;
  }
  else {
    (this->fileName)._M_dataplus._M_p = pcVar3;
    (this->fileName).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->fileName)._M_string_length = _fileName->_M_string_length;
  (_fileName->_M_dataplus)._M_p = (pointer)paVar1;
  _fileName->_M_string_length = 0;
  (_fileName->field_2)._M_local_buf[0] = '\0';
  uVar6 = SkipList::getLength(memTable);
  (this->header).length = uVar6;
  uVar7 = SkipList::getMinKey(memTable);
  (this->header).minKey = uVar7;
  uVar7 = SkipList::getMaxKey(memTable);
  (this->header).maxKey = uVar7;
  (this->header).timeStamp = timeStamp;
  local_38 = SkipList::constBegin(memTable);
  local_40[0] = 0;
  while( true ) {
    bVar5 = SkipList::ConstIterator::hasNext(&local_38);
    if (!bVar5) break;
    SkipList::ConstIterator::next(&local_38);
    __args = SkipList::ConstIterator::key(&local_38);
    std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
    emplace_back<unsigned_long_const&,unsigned_int&>
              ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
               &this->index,__args,local_40);
    psVar8 = SkipList::ConstIterator::value_abi_cxx11_(&local_38);
    local_40[0] = local_40[0] + (int)psVar8->_M_string_length;
  }
  local_40[1] = 0;
  std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
  emplace_back<int,unsigned_int&>
            ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
             &this->index,(int *)(local_40 + 1),local_40);
  return;
}

Assistant:

SSTableCache::SSTableCache(const SkipList &memTable, uint64_t timeStamp,
                           string _fileName)
    : bloomFilter(memTable), fileName(std::move(_fileName)) {
  header.length = memTable.getLength();
  header.minKey = memTable.getMinKey();
  header.maxKey = memTable.getMaxKey();
  header.timeStamp = timeStamp;

  auto i = memTable.constBegin();
  uint32_t offset = 0;
  while (i.hasNext()) {
    i.next();
    index.emplace_back(i.key(), offset);
    offset += i.value().size();
  }
  index.emplace_back(0, offset);
}